

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  char *pcVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  Offset OVar5;
  Type type_local;
  
  OVar5 = this->current_opcode_offset;
  uVar4 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
          state)->offset - OVar5;
  printf(" %06zx:",OVar5);
  uVar2 = 9;
  if (uVar4 < 9) {
    uVar2 = uVar4;
  }
  while (uVar3 = uVar4, uVar2 != 0) {
    printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[OVar5]);
    OVar5 = OVar5 + 1;
    uVar2 = uVar2 - 1;
  }
  for (; uVar3 < 9; uVar3 = uVar3 + 1) {
    printf("   ");
  }
  printf(" | local[%u",(ulong)this->local_index_);
  if (count != 1) {
    printf("..%u",(ulong)((count + this->local_index_) - 1));
  }
  this->local_index_ = this->local_index_ + count;
  pcVar1 = Type::GetName(&type_local);
  printf("] type=%s\n",pcVar1);
  OVar5 = uVar4 + this->current_opcode_offset;
  this->last_opcode_end = OVar5;
  this->current_opcode_offset = OVar5;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", offset);
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[%" PRIindex, local_index_);

  if (count != 1) {
    printf("..%" PRIindex "", local_index_ + count - 1);
  }
  local_index_ += count;

  printf("] type=%s\n", type.GetName());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}